

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O0

bool __thiscall mpt::pipe<char>::unshift(pipe<char> *this,char *elem)

{
  ulong uVar1;
  char *t;
  instance *piStack_28;
  uint8_t buf [1];
  queue *d;
  char *elem_local;
  pipe<char> *this_local;
  
  piStack_28 = reference<mpt::pipe<char>::instance>::instance(&this->_d);
  if (piStack_28 == (instance *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    t._7_1_ = *elem;
    uVar1 = (**(code **)(*(long *)&piStack_28->super_type + 0x58))(piStack_28,(long)&t + 7,1);
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool unshift(const T & elem)
	{
		io::queue *d;
		if (!(d = _d.instance())) {
			return false;
		}
		uint8_t buf[sizeof(T)];
		T *t = static_cast<T *>(static_cast<void *>(buf));
		new (t) T(elem);
		if (d->unshift(t, sizeof(T))) {
			return true;
		}
		t->~T();
		return false;
	}